

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

Node * __thiscall
Lexical::errorParsing
          (Node *__return_storage_ptr__,Lexical *this,int *returnIndex,int errIndex,int errCode)

{
  pointer piVar1;
  int iVar2;
  pointer pIVar3;
  long lVar4;
  long lVar5;
  
  piVar1 = (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)piVar1[-1];
  pIVar3 = (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pIVar3 -
          (long)(this->generator).interCode.
                super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((lVar5 >> 2) * -0x5555555555555555 - lVar4 != 0) {
    do {
      lVar5 = lVar5 + -0xc;
      pIVar3 = pIVar3 + -1;
    } while ((lVar5 >> 2) * -0x5555555555555555 - lVar4 != 0);
    (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar3;
  }
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar1 + -1;
  this->wordIndex = *returnIndex;
  if ((errIndex != -1) && (this->lastErrorIndex <= errIndex)) {
    this->lastErrorIndex = errIndex;
    this->lastErrorCode = errCode;
  }
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,nullNode.name._M_dataplus._M_p,
             nullNode.name._M_dataplus._M_p + nullNode.name._M_string_length);
  __return_storage_ptr__->id = nullNode.id;
  std::vector<Node,_std::allocator<Node>_>::vector(&__return_storage_ptr__->son,&nullNode.son);
  iVar2 = nullNode.to;
  __return_storage_ptr__->fr = nullNode.fr;
  __return_storage_ptr__->to = iVar2;
  return __return_storage_ptr__;
}

Assistant:

Node errorParsing(const int &returnIndex, const int errIndex=-1, const int errCode=-1) {
		generator.recovery();
		wordIndex = returnIndex;
		if (errIndex != -1) {
			if (lastErrorIndex <= errIndex) {
				lastErrorIndex = errIndex;
				lastErrorCode = errCode;
			}
		}
		return nullNode;
	}